

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintTo(char32_t c,ostream *os)

{
  ostream *poVar1;
  
  *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
       *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  poVar1 = std::operator<<(os,"U+");
  *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) | 0x4000;
  poVar1 = std::operator<<(poVar1,0x30);
  *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return;
}

Assistant:

void PrintTo(char32_t c, ::std::ostream* os) {
  *os << std::hex << "U+" << std::uppercase << std::setfill('0') << std::setw(4)
      << static_cast<uint32_t>(c);
}